

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteFloat
               (int field_number,float value,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  uint32 uVar5;
  uint value_00;
  
  value_00 = field_number * 8 + 5;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar4 = pbVar1;
    uVar5 = value_00;
    if (0x7f < (uint)(field_number << 3)) {
      do {
        *pbVar4 = (byte)value_00 | 0x80;
        uVar5 = value_00 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar2 = 0x3fff < value_00;
        value_00 = uVar5;
      } while (bVar2);
    }
    *pbVar4 = (byte)uVar5;
    iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    output->buffer_size_ = output->buffer_size_ - iVar3;
  }
  io::CodedOutputStream::WriteLittleEndian32(output,(uint32)value);
  return;
}

Assistant:

void WireFormatLite::WriteFloat(int field_number, float value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteFloatNoTag(value, output);
}